

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O2

GenerateBlockArraySymbol *
slang::ast::GenerateBlockArraySymbol::fromSyntax
          (Compilation *comp,LoopGenerateSyntax *syntax,SymbolIndex scopeIndex,ASTContext *context,
          uint32_t constructIndex)

{
  TimeUnit *pTVar1;
  uint uVar2;
  Scope *scope;
  Type *this;
  Type *lhs;
  undefined8 uVar3;
  undefined4 uVar4;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  undefined1 auVar5 [16];
  pointer ppGVar6;
  __index_type _Var7;
  bool bVar8;
  TimeScaleMagnitude TVar9;
  int iVar10;
  uint uVar11;
  GenerateBlockArraySymbol *gba;
  GenerateBlockArraySymbol *this_00;
  Scope *pSVar12;
  Symbol *pSVar13;
  Expression *pEVar14;
  StatementBlockSymbol *pSVar15;
  VariableSymbol *symbol;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  *__v;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar16;
  Diagnostic *pDVar17;
  ulong uVar18;
  size_t hash;
  undefined4 extraout_var_01;
  ulong pos0;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_01;
  size_t extraout_RDX_02;
  SVInt *index;
  long lVar19;
  pointer pSVar20;
  DiagCode code;
  Compilation *__addr;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  undefined1 auVar25 [16];
  TimeUnit TVar26;
  TimeScaleMagnitude TVar27;
  TimeUnit TVar28;
  TimeScaleMagnitude TVar29;
  TimeUnit TVar30;
  TimeScaleMagnitude TVar31;
  TimeUnit TVar32;
  TimeScaleMagnitude TVar33;
  TimeUnit TVar34;
  TimeScaleMagnitude TVar35;
  TimeUnit TVar36;
  TimeScaleMagnitude TVar37;
  TimeUnit TVar38;
  TimeScaleMagnitude TVar39;
  TimeUnit TVar40;
  TimeScaleMagnitude TVar41;
  SourceRange SVar42;
  string_view sVar43;
  SourceRange assignmentRange;
  LookupLocation location;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffff868;
  Token genvar;
  IdentifierNameSyntax *genvarSyntax;
  ConstantValue stop;
  uint32_t constructIndex_local;
  SourceRange local_6c8;
  anon_class_48_6_985204b5 createBlock;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> local_688;
  undefined1 local_670 [16];
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  AssertionInstanceDetails *local_640;
  TimeUnit local_638;
  TimeScaleMagnitude TStack_637;
  TimeUnit TStack_636;
  TimeScaleMagnitude TStack_635;
  TimeUnit TStack_634;
  TimeScaleMagnitude TStack_633;
  TimeUnit TStack_632;
  TimeScaleMagnitude TStack_631;
  TimeUnit TStack_630;
  TimeScaleMagnitude TStack_62f;
  TimeUnit TStack_62e;
  TimeScaleMagnitude TStack_62d;
  TimeUnit TStack_62c;
  TimeScaleMagnitude TStack_62b;
  TimeUnit TStack_62a;
  TimeScaleMagnitude TStack_629;
  TimeUnit local_628;
  TimeScaleMagnitude TStack_627;
  TimeUnit TStack_626;
  TimeScaleMagnitude TStack_625;
  _Storage<slang::TimeScale,_true> _Stack_624;
  bool bStack_620;
  TimeScaleMagnitude TStack_61f;
  TimeUnit TStack_61e;
  TimeScaleMagnitude TStack_61d;
  TimeUnit TStack_61c;
  TimeScaleMagnitude TStack_61b;
  TimeUnit TStack_61a;
  TimeScaleMagnitude TStack_619;
  ConstantValue initialVal;
  SmallVector<const_slang::ast::GenerateBlockSymbol_*,_5UL> entries;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_5a8;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_580;
  SmallSet<slang::SVInt,_8UL,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
  usedValues;
  undefined1 local_498 [40];
  SmallVector<slang::SVInt,_8UL> indices;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_3d8;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_3b0;
  EvalContext evalContext;
  Compilation *this_01;
  
  constructIndex_local = constructIndex;
  getGenerateBlockName(&local_688,&((syntax->block).ptr)->super_SyntaxNode);
  this_00 = BumpAllocator::
            emplace<slang::ast::GenerateBlockArraySymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,unsigned_int&>
                      (&comp->super_BumpAllocator,comp,&local_688.first,&local_688.second,
                       &constructIndex_local);
  (this_00->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  syntax_00._M_ptr =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_00._M_extent._M_extent_value =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  Symbol::setAttributes(&this_00->super_Symbol,(context->scope).ptr,syntax_00);
  genvar.kind = (syntax->identifier).kind;
  genvar._2_1_ = (syntax->identifier).field_0x2;
  genvar.numFlags.raw = (syntax->identifier).numFlags;
  genvar.rawLen = (syntax->identifier).rawLen;
  genvar.info = (syntax->identifier).info;
  if ((genvar._0_8_ & 0x10000) != 0) {
    return this_00;
  }
  genvarSyntax = BumpAllocator::emplace<slang::syntax::IdentifierNameSyntax,slang::parsing::Token&>
                           (&comp->super_BumpAllocator,&genvar);
  scope = (context->scope).ptr;
  lVar24 = 0;
  pSVar12 = scope;
  do {
    pSVar13 = pSVar12->thisSym;
    if (pSVar13->kind != GenerateBlock) {
      if (pSVar13->kind != GenerateBlockArray) break;
      lVar24 = (lVar24 + (ulong)(lVar24 == 0)) * *(long *)(pSVar13 + 2);
    }
    pSVar12 = pSVar13->parentScope;
  } while (pSVar12 != (Scope *)0x0);
  uVar2 = (comp->options).maxGenerateSteps;
  if ((syntax->genvar).info == (Info *)0x0) {
    sVar43 = parsing::Token::valueText(&genvar);
    uVar3 = context->scope;
    uVar4 = context->lookupIndex;
    location.index = uVar4;
    location.scope = (Scope *)uVar3;
    local_6c8 = parsing::Token::range(&genvar);
    location._12_4_ = 0;
    in_stack_fffffffffffff868.m_bits = (underlying_type)local_6c8.startLoc;
    pSVar13 = Lookup::unqualifiedAt
                        (scope,sVar43,location,local_6c8,(bitmask<slang::ast::LookupFlags>)0x0);
    if (pSVar13 == (Symbol *)0x0) {
      return this_00;
    }
    if (pSVar13->kind != Genvar) {
      SVar42 = parsing::Token::range(&genvar);
      pDVar17 = ASTContext::addDiag(context,(DiagCode)0x20000a,SVar42);
      sVar43 = parsing::Token::valueText(&genvar);
      Diagnostic::operator<<(pDVar17,sVar43);
      Diagnostic::addNote(pDVar17,(DiagCode)0x50001,pSVar13->location);
      return this_00;
    }
    Compilation::noteReference(comp,pSVar13,false);
  }
  else {
    evalContext.astCtx._0_16_ = parsing::Token::valueText(&genvar);
    usedValues.super_Storage.buffer._0_8_ = parsing::Token::location(&genvar);
    pSVar13 = &BumpAllocator::
               emplace<slang::ast::GenvarSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                         (&comp->super_BumpAllocator,
                          (basic_string_view<char,_std::char_traits<char>_> *)&evalContext,
                          (SourceLocation *)&usedValues)->super_Symbol;
    pSVar13->originatingSyntax = (SyntaxNode *)genvarSyntax;
    Scope::addMember(&this_00->super_Scope,pSVar13);
  }
  createBlock.genvar = &genvar;
  entries.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.data_ =
       (pointer)entries.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.firstElement;
  entries.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.len = 0;
  entries.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.cap = 5;
  createBlock.blockLoc = local_688.second;
  createBlock.entries = &entries;
  createBlock.genvarSyntax = &genvarSyntax;
  this = comp->integerType;
  lhs = (Type *)(syntax->initialExpr).ptr;
  createBlock.comp = comp;
  createBlock.syntax = syntax;
  SVar42 = parsing::Token::range(&syntax->equals);
  assignmentRange.endLoc = (SourceLocation)context;
  assignmentRange.startLoc = SVar42.endLoc;
  pEVar14 = Expression::bindRValue
                      ((Expression *)this,lhs,(ExpressionSyntax *)SVar42.startLoc,assignmentRange,
                       (ASTContext *)0x0,in_stack_fffffffffffff868);
  __addr = (Compilation *)context;
  ASTContext::eval(&initialVal,context,pEVar14,(bitmask<slang::ast::EvalFlags>)0x0);
  if (initialVal.value.
      super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ._M_index != '\0') {
    auVar5._12_4_ = 0;
    auVar5._0_12_ = (undefined1  [12])evalContext.astCtx._4_12_;
    evalContext.astCtx._0_16_ = auVar5 << 0x20;
    usedValues.super_Storage.buffer._0_8_ =
         usedValues.super_Storage.buffer._0_8_ & 0xffffffff00000000;
    pSVar15 = BumpAllocator::
              emplace<slang::ast::StatementBlockSymbol,slang::ast::Compilation&,char_const(&)[1],slang::SourceLocation&,slang::ast::StatementBlockKind,slang::ast::VariableLifetime>
                        (&comp->super_BumpAllocator,comp,(char (*) [1])0x401ea3,&local_688.second,
                         (StatementBlockKind *)&evalContext,(VariableLifetime *)&usedValues);
    evalContext.astCtx._0_16_ = parsing::Token::valueText(&genvar);
    usedValues.super_Storage.buffer._0_8_ = parsing::Token::location(&genvar);
    indices.super_SmallVectorBase<slang::SVInt>.data_ =
         (pointer)((ulong)indices.super_SmallVectorBase<slang::SVInt>.data_._4_4_ << 0x20);
    symbol = BumpAllocator::
             emplace<slang::ast::VariableSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::VariableLifetime>
                       (&comp->super_BumpAllocator,
                        (basic_string_view<char,_std::char_traits<char>_> *)&evalContext,
                        (SourceLocation *)&usedValues,(VariableLifetime *)&indices);
    (symbol->super_ValueSymbol).declaredType.type = comp->integerType;
    *(byte *)&(symbol->flags).m_bits = (byte)(symbol->flags).m_bits | 2;
    (pSVar15->super_Symbol).parentScope = (context->scope).ptr;
    (pSVar15->super_Symbol).indexInScope = scopeIndex;
    Scope::addMember(&pSVar15->super_Scope,(Symbol *)symbol);
    local_670._8_4_ = 0xffffffff;
    local_660 = (undefined1  [16])0x0;
    local_650 = (undefined1  [16])0x0;
    local_640 = (AssertionInstanceDetails *)0x0;
    local_670._0_8_ = &pSVar15->super_Scope;
    iVar10 = Expression::bind((int)(syntax->stopExpr).ptr,(sockaddr *)local_670,0);
    this_01 = (Compilation *)CONCAT44(extraout_var,iVar10);
    __addr = (Compilation *)local_670;
    iVar10 = Expression::bind((int)(syntax->iterationExpr).ptr,(sockaddr *)__addr,8);
    pEVar14 = (Expression *)CONCAT44(extraout_var_00,iVar10);
    bVar8 = Expression::bad((Expression *)this_01);
    if (((!bVar8) && (bVar8 = Expression::bad(pEVar14), !bVar8)) &&
       (__addr = this_01,
       bVar8 = ASTContext::requireBooleanConvertible(context,(Expression *)this_01), bVar8)) {
      evalContext.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_ =
           (pointer)evalContext.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.
                    firstElement;
      evalContext.astCtx.assertionInstance = local_640;
      evalContext.astCtx._12_4_ = local_670._12_4_;
      evalContext.astCtx.lookupIndex = local_670._8_4_;
      evalContext.astCtx.firstTempVar = (TempVarSymbol *)local_650._0_8_;
      evalContext.astCtx.randomizeDetails = (RandomizeDetails *)local_650._8_8_;
      evalContext.astCtx.flags.m_bits = local_660._0_8_;
      evalContext.astCtx.instanceOrProc = (Symbol *)local_660._8_8_;
      evalContext.astCtx.scope.ptr = (Scope *)local_670._0_8_;
      evalContext.flags.m_bits = '\0';
      evalContext._60_16_ = (undefined1  [16])0x0;
      evalContext.queueTarget._4_4_ = 0;
      evalContext.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.len = 0;
      evalContext.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.cap = 2;
      evalContext.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ =
           (pointer)evalContext.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.firstElement;
      evalContext.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.len = 0;
      evalContext.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.cap = 5;
      evalContext.diags.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.data_ =
           (pointer)evalContext.diags.super_SmallVector<slang::Diagnostic,_2UL>.
                    super_SmallVectorBase<slang::Diagnostic>.firstElement;
      evalContext.diags.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.len = 0;
      evalContext.diags.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.cap = 2;
      evalContext.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.data_ =
           (pointer)evalContext.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
                    super_SmallVectorBase<slang::Diagnostic>.firstElement;
      evalContext.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.len = 0;
      evalContext.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.cap = 2;
      evalContext.backtraceReported = false;
      evalContext.disableRange.startLoc = (SourceLocation)0x0;
      evalContext.disableRange.endLoc = (SourceLocation)0x0;
      EvalContext::pushEmptyFrame(&evalContext);
      std::__detail::__variant::
      _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&local_580,
                        (_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                         *)&initialVal);
      __v = &EvalContext::createLocal
                       (&evalContext,&symbol->super_ValueSymbol,(ConstantValue *)&local_580)->value;
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&local_580);
      pvVar16 = std::
                get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                          (__v);
      if ((pvVar16->super_SVIntStorage).unknownFlag == true) {
        SVar42 = parsing::Token::range(&genvar);
        pDVar17 = ASTContext::addDiag((ASTContext *)local_670,(DiagCode)0x3e0006,SVar42);
        Diagnostic::operator<<(pDVar17,(ConstantValue *)__v);
      }
      SmallSet<slang::SVInt,_8UL,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
      ::SmallSet(&usedValues);
      indices.super_SmallVectorBase<slang::SVInt>.data_ =
           (pointer)indices.super_SmallVectorBase<slang::SVInt>.firstElement;
      indices.super_SmallVectorBase<slang::SVInt>.len = 0;
      indices.super_SmallVectorBase<slang::SVInt>.cap = 8;
      uVar18 = 0;
      while( true ) {
        uVar18 = uVar18 + lVar24 + (ulong)(lVar24 == 0);
        if (uVar2 < uVar18) break;
        Expression::eval(&stop,(Expression *)this_01,&evalContext);
        if (stop.value.
            super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ._M_index == '\0') {
          bVar8 = false;
LAB_00359d02:
          this_00->valid = bVar8;
LAB_00359b22:
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)&stop);
          if (indices.super_SmallVectorBase<slang::SVInt>.len == 0) {
            Expression::eval((ConstantValue *)&local_3b0,pEVar14,&evalContext);
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::~_Variant_storage(&local_3b0);
          }
          EvalContext::reportAllDiags(&evalContext);
          src = extraout_RDX;
          if (this_00->valid == true) {
            bVar8 = Scope::isUninstantiated((context->scope).ptr);
            src = extraout_RDX_00;
            pSVar20 = indices.super_SmallVectorBase<slang::SVInt>.data_;
            for (lVar24 = indices.super_SmallVectorBase<slang::SVInt>.len << 4; lVar24 != 0;
                lVar24 = lVar24 + -0x10) {
              std::__detail::__variant::
              _Variant_storage<false,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
              ::_Variant_storage<1ul,slang::SVInt_const&>
                        ((_Variant_storage<false,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                          *)&local_3d8,pSVar20);
              fromSyntax::anon_class_48_6_985204b5::operator()
                        (&createBlock,(ConstantValue *)&local_3d8,bVar8);
              std::__detail::__variant::
              _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ::~_Variant_storage(&local_3d8);
              pSVar20 = pSVar20 + 1;
              src = extraout_RDX_01;
            }
          }
          iVar10 = SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>::copy
                             (&entries.
                               super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>,
                              (EVP_PKEY_CTX *)comp,src);
          ppGVar6 = entries.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.data_;
          (this_00->entries)._M_ptr = (pointer)CONCAT44(extraout_var_01,iVar10);
          (this_00->entries)._M_extent._M_extent_value = extraout_RDX_02;
          if (entries.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.len == 0) {
            SVInt::SVInt((SVInt *)&stop,0x20,0,true);
            comp = (Compilation *)local_498;
            std::
            variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
            ::variant<slang::SVInt,void,void,slang::SVInt,void>
                      ((variant<std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                        *)comp,(SVInt *)&stop);
            fromSyntax::anon_class_48_6_985204b5::operator()
                      (&createBlock,(ConstantValue *)comp,true);
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                 *)local_498);
            SVInt::~SVInt((SVInt *)&stop);
          }
          else {
            lVar22 = entries.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>.len << 3
            ;
            for (lVar24 = 0; lVar22 != lVar24; lVar24 = lVar24 + 8) {
              comp = *(Compilation **)((long)ppGVar6 + lVar24);
              Scope::addMember(&this_00->super_Scope,(Symbol *)comp);
            }
          }
          goto LAB_00359c7f;
        }
        bVar8 = ConstantValue::isTrue(&stop);
        if (!bVar8) {
          bVar8 = stop.value.
                  super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  .
                  super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  .
                  super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  .
                  super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  .
                  super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  .
                  super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  ._M_index != '\0';
          goto LAB_00359d02;
        }
        pvVar16 = std::
                  get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                            (__v);
        SmallVectorBase<slang::SVInt>::emplace_back<slang::SVInt&>
                  (&indices.super_SmallVectorBase<slang::SVInt>,pvVar16);
        pvVar16 = std::
                  get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                            (__v);
        hash = boost::unordered::detail::foa::mulx_mix::
               mix<slang::hash<slang::SVInt,void>,slang::SVInt>
                         ((hash<slang::SVInt,_void> *)&usedValues.super_Storage.field_0x88,pvVar16);
        pos0 = hash >> (usedValues._144_1_ & 0x3f);
        lVar22 = (hash & 0xff) * 4;
        TVar26 = (&UNK_003fea9c)[lVar22];
        TVar27 = (&UNK_003fea9d)[lVar22];
        TVar28 = (&UNK_003fea9e)[lVar22];
        TVar29 = (&UNK_003fea9f)[lVar22];
        uVar21 = 0;
        uVar23 = pos0;
        TVar30 = TVar26;
        TVar31 = TVar27;
        TVar32 = TVar28;
        TVar33 = TVar29;
        TVar34 = TVar26;
        TVar35 = TVar27;
        TVar36 = TVar28;
        TVar37 = TVar29;
        TVar38 = TVar26;
        TVar39 = TVar27;
        TVar40 = TVar28;
        TVar41 = TVar29;
        do {
          pTVar1 = (TimeUnit *)(usedValues._160_8_ + uVar23 * 0x10);
          local_628 = *pTVar1;
          TStack_627 = pTVar1[1];
          TStack_626 = pTVar1[2];
          TStack_625 = pTVar1[3];
          _Stack_624._M_value.base.unit = pTVar1[4];
          _Stack_624._M_value.base.magnitude = pTVar1[5];
          _Stack_624._M_value.precision.unit = pTVar1[6];
          _Stack_624._M_value.precision.magnitude = pTVar1[7];
          bStack_620 = (bool)pTVar1[8];
          TStack_61f = pTVar1[9];
          TStack_61e = pTVar1[10];
          TStack_61d = pTVar1[0xb];
          TStack_61c = pTVar1[0xc];
          TStack_61b = pTVar1[0xd];
          TStack_61a = pTVar1[0xe];
          TVar9 = pTVar1[0xf];
          auVar25[0] = -(local_628 == TVar26);
          auVar25[1] = -(TStack_627 == TVar27);
          auVar25[2] = -(TStack_626 == TVar28);
          auVar25[3] = -(TStack_625 == TVar29);
          auVar25[4] = -(_Stack_624._M_value.base.unit == TVar30);
          auVar25[5] = -(_Stack_624._M_value.base.magnitude == TVar31);
          auVar25[6] = -(_Stack_624._M_value.precision.unit == TVar32);
          auVar25[7] = -(_Stack_624._M_value.precision.magnitude == TVar33);
          auVar25[8] = -(bStack_620 == (bool)TVar34);
          auVar25[9] = -(TStack_61f == TVar35);
          auVar25[10] = -(TStack_61e == TVar36);
          auVar25[0xb] = -(TStack_61d == TVar37);
          auVar25[0xc] = -(TStack_61c == TVar38);
          auVar25[0xd] = -(TStack_61b == TVar39);
          auVar25[0xe] = -(TStack_61a == TVar40);
          auVar25[0xf] = -(TVar9 == TVar41);
          uVar11 = (uint)(ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe);
          TStack_619 = TVar9;
          if (uVar11 != 0) {
            lVar19 = usedValues._160_8_ + uVar23 * 0x10;
            lVar22 = usedValues._168_8_ + uVar23 * 0xf0;
            local_638 = TVar26;
            TStack_637 = TVar27;
            TStack_636 = TVar28;
            TStack_635 = TVar29;
            TStack_634 = TVar30;
            TStack_633 = TVar31;
            TStack_632 = TVar32;
            TStack_631 = TVar33;
            TStack_630 = TVar34;
            TStack_62f = TVar35;
            TStack_62e = TVar36;
            TStack_62d = TVar37;
            TStack_62c = TVar38;
            TStack_62b = TVar39;
            TStack_62a = TVar40;
            TStack_629 = TVar41;
            do {
              iVar10 = 0;
              if (uVar11 != 0) {
                for (; (uVar11 >> iVar10 & 1) == 0; iVar10 = iVar10 + 1) {
                }
              }
              bVar8 = exactlyEqual(pvVar16,(SVInt *)((ulong)(uint)(iVar10 << 4) + lVar22));
              if (bVar8) {
                SVar42 = parsing::Token::range(&genvar);
                code.subsystem = Declarations;
                code.code = 0x3d;
                goto LAB_00359b05;
              }
              uVar11 = uVar11 - 1 & uVar11;
            } while (uVar11 != 0);
            TVar9 = *(TimeScaleMagnitude *)(lVar19 + 0xf);
            TVar26 = local_638;
            TVar27 = TStack_637;
            TVar28 = TStack_636;
            TVar29 = TStack_635;
            TVar30 = TStack_634;
            TVar31 = TStack_633;
            TVar32 = TStack_632;
            TVar33 = TStack_631;
            TVar34 = TStack_630;
            TVar35 = TStack_62f;
            TVar36 = TStack_62e;
            TVar37 = TStack_62d;
            TVar38 = TStack_62c;
            TVar39 = TStack_62b;
            TVar40 = TStack_62a;
            TVar41 = TStack_629;
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & TVar9) == 0) break;
          lVar22 = uVar23 + uVar21;
          uVar21 = uVar21 + 1;
          uVar23 = lVar22 + 1U & usedValues._152_8_;
        } while (uVar21 <= (ulong)usedValues._152_8_);
        if ((ulong)usedValues._184_8_ < (ulong)usedValues._176_8_) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SVInt,void>,std::equal_to<slang::SVInt>,slang::detail::hashing::StackAllocator<slang::SVInt,128ul,16ul>>
          ::unchecked_emplace_at<slang::SVInt&>
                    ((locator *)&local_5a8,
                     (table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SVInt,void>,std::equal_to<slang::SVInt>,slang::detail::hashing::StackAllocator<slang::SVInt,128ul,16ul>>
                      *)&usedValues.super_Storage.field_0x88,pos0,hash,pvVar16);
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SVInt,void>,std::equal_to<slang::SVInt>,slang::detail::hashing::StackAllocator<slang::SVInt,128ul,16ul>>
          ::unchecked_emplace_with_rehash<slang::SVInt&>
                    ((locator *)&local_5a8,
                     (table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::SVInt,void>,std::equal_to<slang::SVInt>,slang::detail::hashing::StackAllocator<slang::SVInt,128ul,16ul>>
                      *)&usedValues.super_Storage.field_0x88,hash,pvVar16);
        }
        Expression::eval((ConstantValue *)&local_5a8,pEVar14,&evalContext);
        _Var7 = local_5a8._M_index;
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage(&local_5a8);
        if (_Var7 == '\0') goto LAB_00359b22;
        pvVar16 = std::
                  get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                            (__v);
        if ((pvVar16->super_SVIntStorage).unknownFlag == true) {
          SVar42 = parsing::Token::range(&genvar);
          code.subsystem = Declarations;
          code.code = 0x3e;
LAB_00359b05:
          pDVar17 = ASTContext::addDiag((ASTContext *)local_670,code,SVar42);
          Diagnostic::operator<<(pDVar17,(ConstantValue *)__v);
          goto LAB_00359b22;
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&stop);
      }
      SVar42 = parsing::Token::range(&syntax->keyword);
      comp = (Compilation *)0x6c0006;
      ASTContext::addDiag(context,(DiagCode)0x6c0006,SVar42);
LAB_00359c7f:
      SmallVectorBase<slang::SVInt>::cleanup
                (&indices.super_SmallVectorBase<slang::SVInt>,(EVP_PKEY_CTX *)comp);
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::SVInt,_void>,_std::equal_to<slang::SVInt>,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
      ::~table_core((table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::SVInt,_void>,_std::equal_to<slang::SVInt>,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
                     *)&usedValues.super_Storage.field_0x88);
      EvalContext::~EvalContext(&evalContext);
      __addr = comp;
    }
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)&initialVal);
  SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>::cleanup
            (&entries.super_SmallVectorBase<const_slang::ast::GenerateBlockSymbol_*>,
             (EVP_PKEY_CTX *)__addr);
  return this_00;
}

Assistant:

GenerateBlockArraySymbol& GenerateBlockArraySymbol::fromSyntax(Compilation& comp,
                                                               const LoopGenerateSyntax& syntax,
                                                               SymbolIndex scopeIndex,
                                                               const ASTContext& context,
                                                               uint32_t constructIndex) {
    auto [name, loc] = getGenerateBlockName(*syntax.block);
    auto result = comp.emplace<GenerateBlockArraySymbol>(comp, name, loc, constructIndex);
    result->setSyntax(syntax);
    result->setAttributes(*context.scope, syntax.attributes);

    auto genvar = syntax.identifier;
    if (genvar.isMissing())
        return *result;

    auto genvarSyntax = comp.emplace<IdentifierNameSyntax>(genvar);

    // Walk up the tree a bit to see if we're nested inside another generate loop.
    // If we are, we'll include that parent's array size in our decision about
    // wether we've looped too many times within one generate block.
    const uint64_t baseCount = getGenerateLoopCount(*context.scope);
    const uint64_t loopLimit = comp.getOptions().maxGenerateSteps;

    // If the loop initializer has a `genvar` keyword, we can use the name directly
    // Otherwise we need to do a lookup to make sure we have the actual genvar somewhere.
    if (!syntax.genvar) {
        auto symbol = Lookup::unqualifiedAt(*context.scope, genvar.valueText(),
                                            context.getLocation(), genvar.range());
        if (!symbol)
            return *result;

        if (symbol->kind != SymbolKind::Genvar) {
            auto& diag = context.addDiag(diag::NotAGenvar, genvar.range());
            diag << genvar.valueText();
            diag.addNote(diag::NoteDeclarationHere, symbol->location);
            return *result;
        }

        comp.noteReference(*symbol);
    }
    else {
        // Fabricate a genvar symbol to live in this array since it was declared inline.
        auto genvarSymbol = comp.emplace<GenvarSymbol>(genvar.valueText(), genvar.location());
        genvarSymbol->setSyntax(*genvarSyntax);
        result->addMember(*genvarSymbol);
    }

    SmallVector<const GenerateBlockSymbol*> entries;
    auto createBlock = [&, blockLoc = loc](ConstantValue value, bool isUninstantiated) {
        // Spec: each generate block gets their own scope, with an implicit
        // localparam of the same name as the genvar.
        auto block = comp.emplace<GenerateBlockSymbol>(comp, "", blockLoc, (uint32_t)entries.size(),
                                                       isUninstantiated);
        auto implicitParam = comp.emplace<ParameterSymbol>(genvar.valueText(), genvar.location(),
                                                           true /* isLocal */, false /* isPort */);
        implicitParam->setSyntax(*genvarSyntax);
        comp.noteReference(*implicitParam);

        block->addMember(*implicitParam);
        block->setSyntax(*syntax.block);

        addBlockMembers(*block, *syntax.block);

        implicitParam->setType(comp.getIntegerType());
        implicitParam->setValue(comp, std::move(value), /* needsCoercion */ false);
        implicitParam->setIsFromGenvar(true);

        block->arrayIndex = &implicitParam->getValue().integer();
        entries.push_back(block);
    };

    // Bind the initialization expression.
    auto& initial = Expression::bindRValue(comp.getIntegerType(), *syntax.initialExpr,
                                           syntax.equals.range(), context);
    ConstantValue initialVal = context.eval(initial);
    if (!initialVal)
        return *result;

    // Fabricate a local variable that will serve as the loop iteration variable.
    auto& iterScope = *comp.emplace<StatementBlockSymbol>(comp, "", loc,
                                                          StatementBlockKind::Sequential,
                                                          VariableLifetime::Automatic);
    auto& local = *comp.emplace<VariableSymbol>(genvar.valueText(), genvar.location(),
                                                VariableLifetime::Automatic);
    local.setType(comp.getIntegerType());
    local.flags |= VariableFlags::CompilerGenerated;

    iterScope.setTemporaryParent(*context.scope, scopeIndex);
    iterScope.addMember(local);

    // Bind the stop and iteration expressions so we can reuse them on each iteration.
    ASTContext iterContext(iterScope, LookupLocation::max);
    auto& stopExpr = Expression::bind(*syntax.stopExpr, iterContext);
    auto& iterExpr = Expression::bind(*syntax.iterationExpr, iterContext,
                                      ASTFlags::AssignmentAllowed);
    if (stopExpr.bad() || iterExpr.bad())
        return *result;

    if (!context.requireBooleanConvertible(stopExpr))
        return *result;

    // Create storage for the iteration variable.
    EvalContext evalContext(iterContext);
    evalContext.pushEmptyFrame();

    auto loopVal = evalContext.createLocal(&local, initialVal);
    if (loopVal->integer().hasUnknown())
        iterContext.addDiag(diag::GenvarUnknownBits, genvar.range()) << *loopVal;

    // Generate blocks! In the first pass we evaluate all indices for correctness,
    // letting us enforce the loop limit to detect infinite loops before trying
    // to generate more hierarchy.
    uint64_t loopCount = 0;
    SmallSet<SVInt, 8> usedValues;
    SmallVector<SVInt, 8> indices;
    while (true) {
        loopCount += baseCount;
        if (loopCount > loopLimit) {
            context.addDiag(diag::MaxGenerateStepsExceeded, syntax.keyword.range());
            return *result;
        }

        auto stop = stopExpr.eval(evalContext);
        if (stop.bad() || !stop.isTrue()) {
            result->valid = !stop.bad();
            break;
        }

        indices.emplace_back(loopVal->integer());
        auto pair = usedValues.emplace(loopVal->integer());
        if (!pair.second) {
            iterContext.addDiag(diag::GenvarDuplicate, genvar.range()) << *loopVal;
            break;
        }

        if (!iterExpr.eval(evalContext))
            break;

        if (loopVal->integer().hasUnknown()) {
            iterContext.addDiag(diag::GenvarUnknownBits, genvar.range()) << *loopVal;
            break;
        }
    }

    // If we never ran the iteration expression, run it once to ensure
    // we've collected all errors.
    if (indices.empty())
        iterExpr.eval(evalContext);

    evalContext.reportAllDiags();

    // If the generate loop completed successfully, go through and create blocks.
    if (result->valid) {
        bool isUninstantiated = context.scope->isUninstantiated();
        for (auto& index : indices)
            createBlock(index, isUninstantiated);
    }

    result->entries = entries.copy(comp);
    if (entries.empty()) {
        createBlock(SVInt(32, 0, true), true);
    }
    else {
        for (auto entry : entries)
            result->addMember(*entry);
    }

    return *result;
}